

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse1PCRE(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_3a8;
  Arg local_228;
  undefined1 local_218 [8];
  StringPiece sp1;
  undefined1 local_78 [8];
  PCRE re;
  int i;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  for (re.hit_limit_ = 0; re.hit_limit_ < iters; re.hit_limit_ = re.hit_limit_ + 1) {
    PCRE::PCRE((PCRE *)local_78,regexp,EnabledCompileOptions);
    __lhs = PCRE::error_abi_cxx11_((PCRE *)local_78);
    bVar1 = std::operator==(__lhs,"");
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp1.length_,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4d3);
      poVar2 = LogMessage::stream((LogMessage *)&sp1.length_);
      std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp1.length_);
    }
    StringPiece::StringPiece((StringPiece *)local_218);
    PCRE::Arg::Arg(&local_228,(StringPiece *)local_218);
    bVar1 = PCRE::FullMatchFunctor::operator()
                      ((FullMatchFunctor *)&PCRE::FullMatch,text,(PCRE *)local_78,&local_228,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4d5);
      poVar2 = LogMessage::stream(&local_3a8);
      std::operator<<(poVar2,"Check failed: PCRE::FullMatch(text, re, &sp1)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3a8);
    }
    PCRE::~PCRE((PCRE *)local_78);
  }
  return;
}

Assistant:

void Parse1PCRE(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    PCRE re(regexp, PCRE::UTF8);
    CHECK_EQ(re.error(), "");
    StringPiece sp1;
    CHECK(PCRE::FullMatch(text, re, &sp1));
  }
}